

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

uint64_t __thiscall RPCHelpMan::ArgValue<unsigned_long>(RPCHelpMan *this,size_t i)

{
  unsigned_long uVar1;
  long in_FS_OFFSET;
  CheckFn *unaff_retaddr;
  UniValue *maybe_arg;
  char *in_stack_00000020;
  int in_stack_0000002c;
  char *in_stack_00000030;
  UniValue *in_stack_00000038;
  size_t in_stack_fffffffffffffff0;
  vector<RPCArg,_std::allocator<RPCArg>_> *params;
  
  params = *(vector<RPCArg,_std::allocator<RPCArg>_> **)(in_FS_OFFSET + 0x28);
  DetailMaybeArg(unaff_retaddr,params,(JSONRPCRequest *)maybe_arg,in_stack_fffffffffffffff0);
  inline_check_non_fatal<UniValue_const*&>
            ((UniValue **)in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000020,
             (char *)maybe_arg);
  uVar1 = UniValue::getInt<unsigned_long>(in_stack_00000038);
  if (*(vector<RPCArg,_std::allocator<RPCArg>_> **)(in_FS_OFFSET + 0x28) == params) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool RPCHelpMan::IsValidNumArgs(size_t num_args) const
{
    size_t num_required_args = 0;
    for (size_t n = m_args.size(); n > 0; --n) {
        if (!m_args.at(n - 1).IsOptional()) {
            num_required_args = n;
            break;
        }
    }
    return num_required_args <= num_args && num_args <= m_args.size();
}